

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall xmrig::Pool::Pool(Pool *this,Value *object)

{
  bool bVar1;
  int keepAlive;
  uint64_t uVar2;
  Value *this_00;
  Pool *in_RDI;
  Value *keepalive;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar3;
  Value *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 uVar4;
  Value *in_stack_ffffffffffffff08;
  bitset<2UL> *obj;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  
  in_RDI->m_keepAlive = 0;
  in_RDI->m_mode = MODE_POOL;
  std::bitset<2UL>::bitset
            ((bitset<2UL> *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,
                                        CONCAT14(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                )))),(unsigned_long_long)in_stack_fffffffffffffef8);
  String::String(&in_RDI->m_fingerprint);
  String::String(&in_RDI->m_password);
  String::String(&in_RDI->m_rigId);
  String::String(&in_RDI->m_user);
  in_RDI->m_pollInterval = 1000;
  Url::Url((Url *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  Json::getString(in_stack_ffffffffffffff08,
                  (char *)CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT15(in_stack_ffffffffffffff05,
                                                     CONCAT14(in_stack_ffffffffffffff04,
                                                              in_stack_ffffffffffffff00)))),
                  (char *)in_stack_fffffffffffffef8);
  Url::Url((Url *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
           (char *)in_stack_ffffffffffffff08);
  bVar1 = Url::isValid((Url *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (bVar1) {
    Json::getString(in_stack_ffffffffffffff08,
                    (char *)CONCAT17(in_stack_ffffffffffffff07,
                                     CONCAT16(in_stack_ffffffffffffff06,
                                              CONCAT15(in_stack_ffffffffffffff05,
                                                       CONCAT14(in_stack_ffffffffffffff04,
                                                                in_stack_ffffffffffffff00)))),
                    (char *)in_stack_fffffffffffffef8);
    String::operator=((String *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (char *)CONCAT17(in_stack_fffffffffffffeef,
                                       CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)
                                      ));
    Json::getString(in_stack_ffffffffffffff08,
                    (char *)CONCAT17(in_stack_ffffffffffffff07,
                                     CONCAT16(in_stack_ffffffffffffff06,
                                              CONCAT15(in_stack_ffffffffffffff05,
                                                       CONCAT14(in_stack_ffffffffffffff04,
                                                                in_stack_ffffffffffffff00)))),
                    (char *)in_stack_fffffffffffffef8);
    String::operator=((String *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (char *)CONCAT17(in_stack_fffffffffffffeef,
                                       CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)
                                      ));
    Json::getString(in_stack_ffffffffffffff08,
                    (char *)CONCAT17(in_stack_ffffffffffffff07,
                                     CONCAT16(in_stack_ffffffffffffff06,
                                              CONCAT15(in_stack_ffffffffffffff05,
                                                       CONCAT14(in_stack_ffffffffffffff04,
                                                                in_stack_ffffffffffffff00)))),
                    (char *)in_stack_fffffffffffffef8);
    String::operator=((String *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (char *)CONCAT17(in_stack_fffffffffffffeef,
                                       CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)
                                      ));
    Json::getString(in_stack_ffffffffffffff08,
                    (char *)CONCAT17(in_stack_ffffffffffffff07,
                                     CONCAT16(in_stack_ffffffffffffff06,
                                              CONCAT15(in_stack_ffffffffffffff05,
                                                       CONCAT14(in_stack_ffffffffffffff04,
                                                                in_stack_ffffffffffffff00)))),
                    (char *)in_stack_fffffffffffffef8);
    String::operator=((String *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (char *)CONCAT17(in_stack_fffffffffffffeef,
                                       CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)
                                      ));
    uVar2 = Json::getUint64(in_stack_ffffffffffffff08,
                            (char *)CONCAT17(in_stack_ffffffffffffff07,
                                             CONCAT16(in_stack_ffffffffffffff06,
                                                      CONCAT15(in_stack_ffffffffffffff05,
                                                               CONCAT14(in_stack_ffffffffffffff04,
                                                                        in_stack_ffffffffffffff00)))
                                            ),(uint64_t)in_stack_fffffffffffffef8);
    in_RDI->m_pollInterval = uVar2;
    Json::getString(in_stack_ffffffffffffff08,
                    (char *)CONCAT17(in_stack_ffffffffffffff07,
                                     CONCAT16(in_stack_ffffffffffffff06,
                                              CONCAT15(in_stack_ffffffffffffff05,
                                                       CONCAT14(in_stack_ffffffffffffff04,
                                                                in_stack_ffffffffffffff00)))),
                    (char *)in_stack_fffffffffffffef8);
    Url::Url((Url *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             (char *)in_stack_ffffffffffffff08);
    Url::operator=((Url *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (Url *)CONCAT17(in_stack_fffffffffffffeef,
                                   CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
    Url::~Url((Url *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    Json::getBool(in_stack_ffffffffffffff08,
                  (char *)CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT15(in_stack_ffffffffffffff05,
                                                     CONCAT14(in_stack_ffffffffffffff04,
                                                              in_stack_ffffffffffffff00)))),
                  SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
    std::bitset<2UL>::set
              ((bitset<2UL> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,
                                          CONCAT14(in_stack_ffffffffffffff04,
                                                   in_stack_ffffffffffffff00)))),
               (size_t)in_stack_fffffffffffffef8,SUB41((uint)in_stack_fffffffffffffef4 >> 0x18,0));
    obj = &in_RDI->m_flags;
    bVar1 = Json::getBool((Value *)obj,
                          (char *)CONCAT17(in_stack_ffffffffffffff07,
                                           CONCAT16(in_stack_ffffffffffffff06,
                                                    CONCAT15(in_stack_ffffffffffffff05,
                                                             CONCAT14(in_stack_ffffffffffffff04,
                                                                      in_stack_ffffffffffffff00)))),
                          SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
    uVar4 = true;
    if (!bVar1) {
      in_stack_ffffffffffffff06 = Url::isTLS(&in_RDI->m_url);
      uVar4 = in_stack_ffffffffffffff06;
    }
    std::bitset<2UL>::set
              ((bitset<2UL> *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff06,
                                       CONCAT15(in_stack_ffffffffffffff05,
                                                CONCAT14(in_stack_ffffffffffffff04,
                                                         in_stack_ffffffffffffff00)))),
               (size_t)in_stack_fffffffffffffef8,SUB41((uint)in_stack_fffffffffffffef4 >> 0x18,0));
    bVar1 = Url::isValid((Url *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (bVar1) {
      in_RDI->m_mode = MODE_SELF_SELECT;
    }
    else {
      bVar1 = Json::getBool((Value *)obj,
                            (char *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff06,
                                                            CONCAT15(bVar1,CONCAT14(
                                                  in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00)))),
                            SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
      if (bVar1) {
        in_RDI->m_mode = MODE_DAEMON;
      }
    }
    this_00 = Json::getValue(in_stack_fffffffffffffef8,
                             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(this_00);
    uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
    if (bVar1) {
      keepAlive = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt(this_00);
      setKeepAlive(in_RDI,keepAlive);
    }
    else {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsBool(this_00);
      if (bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetBool(this_00);
        setKeepAlive((Pool *)CONCAT44(uVar3,in_stack_fffffffffffffef0),bVar1);
      }
    }
  }
  return;
}

Assistant:

xmrig::Pool::Pool(const rapidjson::Value &object) :
    m_flags(1 << FLAG_ENABLED),
    m_pollInterval(kDefaultPollInterval),
    m_url(Json::getString(object, kUrl))
{
    if (!m_url.isValid()) {
        return;
    }

    m_user         = Json::getString(object, kUser);
    m_password     = Json::getString(object, kPass);
    m_rigId        = Json::getString(object, kRigId);
    m_fingerprint  = Json::getString(object, kFingerprint);
    m_pollInterval = Json::getUint64(object, kDaemonPollInterval, kDefaultPollInterval);
    m_daemon       = Json::getString(object, kSelfSelect);

    m_flags.set(FLAG_ENABLED,  Json::getBool(object, kEnabled, true));
    m_flags.set(FLAG_TLS,      Json::getBool(object, kTls) || m_url.isTLS());

    if (m_daemon.isValid()) {
        m_mode = MODE_SELF_SELECT;
    }
    else if (Json::getBool(object, kDaemon)) {
        m_mode = MODE_DAEMON;
    }

    const rapidjson::Value &keepalive = Json::getValue(object, kKeepalive);
    if (keepalive.IsInt()) {
        setKeepAlive(keepalive.GetInt());
    }
    else if (keepalive.IsBool()) {
        setKeepAlive(keepalive.GetBool());
    }
}